

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O0

int __thiscall Configurator::configure(Configurator *this,string *hmhome)

{
  string *in_RSI;
  Configurator *in_RDI;
  string *in_stack_00000008;
  Configurator *in_stack_00000010;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  configure_home_path(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_30);
  print_configuaration(in_RDI);
  return 0;
}

Assistant:

int configure(const std::string hmhome) {
    configure_home_path(hmhome);
    print_configuaration();
    return 0;
  }